

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

NodeSequence __thiscall
GraphBuilder::insertFunctionPointerCall(GraphBuilder *this,CallInst *callInstruction)

{
  bool bVar1;
  GraphBuilder *pGVar2;
  size_type sVar3;
  iterator this_00;
  reference ppFVar4;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *in_RDI;
  NodeSequence NVar5;
  NodeSequence nodeSeq_2;
  NodeSequence nodeSeq_1;
  NodeSequence nodeSeq;
  Function *function;
  iterator __end2;
  iterator __begin2;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range2;
  Node *returnNode;
  CallFuncPtrNode *callFuncPtrNode;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> functions;
  Value *calledValue;
  undefined1 in_stack_ffffffffffffff60 [16];
  undefined1 in_stack_ffffffffffffff70 [16];
  GraphBuilder *pGVar6;
  NodeSequence in_stack_ffffffffffffff80;
  Node *in_stack_ffffffffffffff90;
  Node *node;
  Node *in_stack_ffffffffffffff98;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  local_60;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *local_58;
  Node *in_stack_ffffffffffffffb0;
  GraphBuilder *in_stack_ffffffffffffffb8;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_40;
  Value *local_28;
  NodeSequence local_10;
  
  local_28 = llvm::CallBase::getCalledOperand((CallBase *)0x195120);
  dg::getCalledFunctions
            ((Value *)in_stack_ffffffffffffffb8,(LLVMPointerAnalysis *)in_stack_ffffffffffffffb0);
  createNode<(NodeType)8,llvm::CallInst_const*>(in_stack_ffffffffffffff60._0_8_);
  pGVar2 = (GraphBuilder *)
           addNode<CallFuncPtrNode>
                     (in_stack_ffffffffffffffb8,(CallFuncPtrNode *)in_stack_ffffffffffffffb0);
  sVar3 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::size
                    (&local_40);
  pGVar6 = (GraphBuilder *)in_stack_ffffffffffffff80.first;
  if (sVar3 < 2) {
    sVar3 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::size
                      (&local_40);
    pGVar2 = in_stack_ffffffffffffff70._0_8_;
    if (sVar3 == 1) {
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::front
                (in_stack_ffffffffffffff60._0_8_);
      NVar5 = insertFunction(pGVar6,in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_)
      ;
      pGVar2 = (GraphBuilder *)NVar5.first;
      Node::addSuccessor(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    else {
      buildGeneralCallInstruction(pGVar2,in_stack_ffffffffffffff60._8_8_);
      Node::addSuccessor(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  else {
    createNode<(NodeType)9>();
    addNode<CallReturnNode>(pGVar2,(CallReturnNode *)in_stack_ffffffffffffffb0);
    local_58 = &local_40;
    local_60._M_current =
         (Function **)
         std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin(in_RDI)
    ;
    this_00 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
                        (in_RDI);
    while( true ) {
      pGVar6 = (GraphBuilder *)in_stack_ffffffffffffff80.first;
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff60._0_8_,
                         (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                          *)in_RDI);
      pGVar2 = in_stack_ffffffffffffff70._0_8_;
      if (!bVar1) break;
      ppFVar4 = __gnu_cxx::
                __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                ::operator*(&local_60);
      node = (Node *)*ppFVar4;
      in_stack_ffffffffffffff80 =
           insertFunction(pGVar6,in_stack_ffffffffffffff70._8_8_,in_stack_ffffffffffffff70._0_8_);
      Node::addSuccessor((Node *)this_00._M_current,node);
      Node::addSuccessor((Node *)this_00._M_current,node);
      __gnu_cxx::
      __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
      ::operator++(&local_60);
    }
  }
  std::pair<Node_*,_Node_*>::pair<CallFuncPtrNode_*&,_Node_*&,_true>
            (&local_10,(CallFuncPtrNode **)&stack0xffffffffffffffb8,
             (Node **)&stack0xffffffffffffffb0);
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)pGVar2);
  return local_10;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertFunctionPointerCall(const CallInst *callInstruction) {
#if LLVM_VERSION_MAJOR >= 8
    auto *calledValue = callInstruction->getCalledOperand();
#else
    auto *calledValue = callInstruction->getCalledValue();
#endif
    auto functions = getCalledFunctions(calledValue, pointsToAnalysis_);

    auto *callFuncPtrNode =
            addNode(createNode<NodeType::CALL_FUNCPTR>(callInstruction));
    Node *returnNode;

    if (functions.size() > 1) {
        returnNode = addNode(createNode<NodeType::CALL_RETURN>());
        for (const auto *function : functions) {
            auto nodeSeq = insertFunction(function, callInstruction);
            callFuncPtrNode->addSuccessor(nodeSeq.first);
            nodeSeq.second->addSuccessor(returnNode);
        }
    } else if (functions.size() == 1) {
        auto nodeSeq = insertFunction(functions.front(), callInstruction);
        callFuncPtrNode->addSuccessor(nodeSeq.first);
        returnNode = nodeSeq.second;
    } else {
        auto nodeSeq = buildGeneralCallInstruction(callInstruction);
        callFuncPtrNode->addSuccessor(nodeSeq.first);
        returnNode = nodeSeq.second;
    }
    return {callFuncPtrNode, returnNode};
}